

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::GeomMesh>
               (GeomMesh *mesh,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *prop_names,bool attr_prop,bool rel_prop)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (prop_names !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar1 = GetGPrimPropertyNamesImpl(&mesh->super_GPrim,prop_names,attr_prop,rel_prop);
    if (attr_prop && bVar1) {
      if (((((mesh->points)._attrib.has_value_ != false) ||
           ((mesh->points)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (mesh->points)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start)) || ((mesh->points)._value_empty != false)) ||
         ((mesh->points)._blocked == true)) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"points","");
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if ((((mesh->normals)._attrib.has_value_ != false) ||
          ((mesh->normals)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (mesh->normals)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((mesh->normals)._value_empty != false || (bVar1 = true, (mesh->normals)._blocked == true)
          ))) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"normals","");
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        bVar1 = true;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool GetPrimPropertyNamesImpl(const GeomMesh &mesh,
                              std::vector<std::string> *prop_names,
                              bool attr_prop, bool rel_prop) {
  if (!prop_names) {
    return false;
  }

  if (!GetGPrimPropertyNamesImpl(&mesh, prop_names, attr_prop, rel_prop)) {
    return false;
  }

  if (attr_prop) {
    if (mesh.points.authored()) {
      prop_names->push_back("points");
    }

    if (mesh.normals.authored()) {
      prop_names->push_back("normals");
    }

    DCOUT("TODO: more attrs...");
  }

  return true;
}